

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_conncache_remove_conn(connectdata *conn,_Bool lock)

{
  connectbundle *cb_ptr;
  Curl_easy *data;
  conncache *hash;
  curl_hash_element *pcVar1;
  curl_hash_iterator iter;
  curl_hash_iterator local_40;
  
  cb_ptr = conn->bundle;
  if (cb_ptr != (connectbundle *)0x0) {
    data = conn->data;
    hash = (data->state).conn_cache;
    if ((lock) && (data->share != (Curl_share *)0x0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    bundle_remove_conn(cb_ptr,conn);
    if ((cb_ptr->num_connections == 0) && (hash != (conncache *)0x0)) {
      Curl_hash_start_iterate(&hash->hash,&local_40);
      pcVar1 = Curl_hash_next_element(&local_40);
      if (pcVar1 != (curl_hash_element *)0x0) {
        do {
          if ((connectbundle *)pcVar1->ptr == cb_ptr) {
            Curl_hash_delete(&hash->hash,pcVar1->key,pcVar1->key_len);
            break;
          }
          pcVar1 = Curl_hash_next_element(&local_40);
        } while (pcVar1 != (curl_hash_element *)0x0);
      }
    }
    conn->bundle = (connectbundle *)0x0;
    if (hash != (conncache *)0x0) {
      hash->num_conn = hash->num_conn - 1;
    }
    if ((lock) && (conn->data->share != (Curl_share *)0x0)) {
      Curl_share_unlock(conn->data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct connectdata *conn, bool lock)
{
  struct Curl_easy *data = conn->data;
  struct connectbundle *bundle = conn->bundle;
  struct conncache *connc = data->state.conn_cache;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    if(lock) {
      CONN_LOCK(conn->data);
    }
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0)
      conncache_remove_bundle(connc, bundle);
    conn->bundle = NULL; /* removed from it */
    if(connc) {
      connc->num_conn--;
      DEBUGF(infof(conn->data, "The cache now contains %"
                   CURL_FORMAT_CURL_OFF_TU " members\n",
                   (curl_off_t) connc->num_conn));
    }
    if(lock) {
      CONN_UNLOCK(conn->data);
    }
  }
}